

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::exponential(QLocale *this)

{
  QLocaleData *in_RDI;
  
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d0119);
  QLocaleData::exponentSeparator(in_RDI);
  return (QString *)in_RDI;
}

Assistant:

QString QLocale::exponential() const
{
    return d->m_data->exponentSeparator();
}